

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall xatlas::internal::ArrayBase::resize(ArrayBase *this,uint32_t newSize,bool exact)

{
  uint uVar1;
  
  this->size = newSize;
  if (this->capacity < newSize) {
    uVar1 = 0;
    if (!exact) {
      uVar1 = newSize >> 2;
    }
    if (this->capacity == 0) {
      uVar1 = 0;
    }
    setArrayCapacity(this,uVar1 + newSize);
    return;
  }
  return;
}

Assistant:

void resize(uint32_t newSize, bool exact)
	{
		size = newSize;
		if (size > capacity) {
			// First allocation is always exact. Otherwise, following allocations grow array to 150% of desired size.
			uint32_t newBufferSize;
			if (capacity == 0 || exact)
				newBufferSize = size;
			else
				newBufferSize = size + (size >> 2);
			setArrayCapacity(newBufferSize);
		}
	}